

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

int32_t __thiscall
icu_63::RuleBasedCollator::internalGetShortDefinitionString
          (RuleBasedCollator *this,char *locale,char *buffer,int32_t capacity,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  UColAttributeValue UVar3;
  char *__src;
  char local_188 [8];
  char subtag [100];
  CharString result;
  char local_d8 [4];
  int32_t length;
  char resultLocale [158];
  UErrorCode *errorCode_local;
  int32_t capacity_local;
  char *buffer_local;
  char *locale_local;
  RuleBasedCollator *this_local;
  
  unique0x1000061a = errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  if (buffer == (char *)0x0) {
    if (capacity != 0) {
LAB_00278979:
      *stack0xffffffffffffffc8 = U_ILLEGAL_ARGUMENT_ERROR;
      return 0;
    }
  }
  else if (capacity < 0) goto LAB_00278979;
  buffer_local = locale;
  if (locale == (char *)0x0) {
    buffer_local = internalGetLocaleID(this,ULOC_VALID_LOCALE,stack0xffffffffffffffc8);
  }
  iVar2 = ucol_getFunctionalEquivalent_63
                    (local_d8,0x9d,"collation",buffer_local,(UBool *)0x0,stack0xffffffffffffffc8);
  UVar1 = ::U_FAILURE(*stack0xffffffffffffffc8);
  if (UVar1 == '\0') {
    if (iVar2 == 0) {
      strcpy(local_d8,"root");
    }
    else {
      local_d8[iVar2] = '\0';
    }
    CharString::CharString((CharString *)(subtag + 0x60));
    UVar1 = attributeHasBeenSetExplicitly(this,1);
    if (UVar1 != '\0') {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])
                        (this,1,stack0xffffffffffffffc8);
      anon_unknown_16::appendAttribute
                ((CharString *)(subtag + 0x60),'A',UVar3,stack0xffffffffffffffc8);
    }
    UVar1 = attributeHasBeenSetExplicitly(this,2);
    if (UVar1 != '\0') {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])
                        (this,2,stack0xffffffffffffffc8);
      anon_unknown_16::appendAttribute
                ((CharString *)(subtag + 0x60),'C',UVar3,stack0xffffffffffffffc8);
    }
    UVar1 = attributeHasBeenSetExplicitly(this,7);
    if (UVar1 != '\0') {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])
                        (this,7,stack0xffffffffffffffc8);
      anon_unknown_16::appendAttribute
                ((CharString *)(subtag + 0x60),'D',UVar3,stack0xffffffffffffffc8);
    }
    UVar1 = attributeHasBeenSetExplicitly(this,3);
    if (UVar1 != '\0') {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])
                        (this,3,stack0xffffffffffffffc8);
      anon_unknown_16::appendAttribute
                ((CharString *)(subtag + 0x60),'E',UVar3,stack0xffffffffffffffc8);
    }
    UVar1 = attributeHasBeenSetExplicitly(this,0);
    if (UVar1 != '\0') {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])
                        (this,0,stack0xffffffffffffffc8);
      anon_unknown_16::appendAttribute
                ((CharString *)(subtag + 0x60),'F',UVar3,stack0xffffffffffffffc8);
    }
    iVar2 = uloc_getKeywordValue_63(local_d8,"collation",local_188,100,stack0xffffffffffffffc8);
    anon_unknown_16::appendSubtag
              ((CharString *)(subtag + 0x60),'K',local_188,iVar2,stack0xffffffffffffffc8);
    iVar2 = uloc_getLanguage_63(local_d8,local_188,100,stack0xffffffffffffffc8);
    anon_unknown_16::appendSubtag
              ((CharString *)(subtag + 0x60),'L',local_188,iVar2,stack0xffffffffffffffc8);
    UVar1 = attributeHasBeenSetExplicitly(this,4);
    if (UVar1 != '\0') {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])
                        (this,4,stack0xffffffffffffffc8);
      anon_unknown_16::appendAttribute
                ((CharString *)(subtag + 0x60),'N',UVar3,stack0xffffffffffffffc8);
    }
    iVar2 = uloc_getCountry_63(local_d8,local_188,100,stack0xffffffffffffffc8);
    anon_unknown_16::appendSubtag
              ((CharString *)(subtag + 0x60),'R',local_188,iVar2,stack0xffffffffffffffc8);
    UVar1 = attributeHasBeenSetExplicitly(this,5);
    if (UVar1 != '\0') {
      UVar3 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])
                        (this,5,stack0xffffffffffffffc8);
      anon_unknown_16::appendAttribute
                ((CharString *)(subtag + 0x60),'S',UVar3,stack0xffffffffffffffc8);
    }
    iVar2 = uloc_getVariant_63(local_d8,local_188,100,stack0xffffffffffffffc8);
    anon_unknown_16::appendSubtag
              ((CharString *)(subtag + 0x60),'V',local_188,iVar2,stack0xffffffffffffffc8);
    iVar2 = uloc_getScript_63(local_d8,local_188,100,stack0xffffffffffffffc8);
    anon_unknown_16::appendSubtag
              ((CharString *)(subtag + 0x60),'Z',local_188,iVar2,stack0xffffffffffffffc8);
    UVar1 = ::U_FAILURE(*stack0xffffffffffffffc8);
    if (UVar1 == '\0') {
      iVar2 = CharString::length((CharString *)(subtag + 0x60));
      if (iVar2 <= capacity) {
        __src = CharString::data((CharString *)(subtag + 0x60));
        iVar2 = CharString::length((CharString *)(subtag + 0x60));
        memcpy(buffer,__src,(long)iVar2);
      }
      iVar2 = CharString::length((CharString *)(subtag + 0x60));
      this_local._4_4_ = u_terminateChars_63(buffer,capacity,iVar2,stack0xffffffffffffffc8);
    }
    else {
      this_local._4_4_ = 0;
    }
    CharString::~CharString((CharString *)(subtag + 0x60));
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
RuleBasedCollator::internalGetShortDefinitionString(const char *locale,
                                                    char *buffer, int32_t capacity,
                                                    UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(buffer == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(locale == NULL) {
        locale = internalGetLocaleID(ULOC_VALID_LOCALE, errorCode);
    }

    char resultLocale[ULOC_FULLNAME_CAPACITY + 1];
    int32_t length = ucol_getFunctionalEquivalent(resultLocale, ULOC_FULLNAME_CAPACITY,
                                                  "collation", locale,
                                                  NULL, &errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(length == 0) {
        uprv_strcpy(resultLocale, "root");
    } else {
        resultLocale[length] = 0;
    }

    // Append items in alphabetic order of their short definition letters.
    CharString result;
    char subtag[ULOC_KEYWORD_AND_VALUES_CAPACITY];

    if(attributeHasBeenSetExplicitly(UCOL_ALTERNATE_HANDLING)) {
        appendAttribute(result, 'A', getAttribute(UCOL_ALTERNATE_HANDLING, errorCode), errorCode);
    }
    // ATTR_VARIABLE_TOP not supported because 'B' was broken.
    // See ICU tickets #10372 and #10386.
    if(attributeHasBeenSetExplicitly(UCOL_CASE_FIRST)) {
        appendAttribute(result, 'C', getAttribute(UCOL_CASE_FIRST, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_NUMERIC_COLLATION)) {
        appendAttribute(result, 'D', getAttribute(UCOL_NUMERIC_COLLATION, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_CASE_LEVEL)) {
        appendAttribute(result, 'E', getAttribute(UCOL_CASE_LEVEL, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_FRENCH_COLLATION)) {
        appendAttribute(result, 'F', getAttribute(UCOL_FRENCH_COLLATION, errorCode), errorCode);
    }
    // Note: UCOL_HIRAGANA_QUATERNARY_MODE is deprecated and never changes away from default.
    length = uloc_getKeywordValue(resultLocale, "collation", subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'K', subtag, length, errorCode);
    length = uloc_getLanguage(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'L', subtag, length, errorCode);
    if(attributeHasBeenSetExplicitly(UCOL_NORMALIZATION_MODE)) {
        appendAttribute(result, 'N', getAttribute(UCOL_NORMALIZATION_MODE, errorCode), errorCode);
    }
    length = uloc_getCountry(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'R', subtag, length, errorCode);
    if(attributeHasBeenSetExplicitly(UCOL_STRENGTH)) {
        appendAttribute(result, 'S', getAttribute(UCOL_STRENGTH, errorCode), errorCode);
    }
    length = uloc_getVariant(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'V', subtag, length, errorCode);
    length = uloc_getScript(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'Z', subtag, length, errorCode);

    if(U_FAILURE(errorCode)) { return 0; }
    if(result.length() <= capacity) {
        uprv_memcpy(buffer, result.data(), result.length());
    }
    return u_terminateChars(buffer, capacity, result.length(), &errorCode);
}